

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O1

CResult * __thiscall CConsole::CResult::operator=(CResult *this,CResult *Other)

{
  ulong uVar1;
  ulong uVar2;
  char *source;
  
  if (this != Other) {
    memcpy(&(this->super_IResult).m_NumArgs,&(Other->super_IResult).m_NumArgs,0x88);
    source = Other->m_aStringStorage;
    mem_copy(this->m_aStringStorage,source,0x401);
    this->m_pArgsStart = Other->m_pArgsStart + (0x90 - (long)source) + (long)&this->super_IResult;
    this->m_pCommand = Other->m_pCommand + (0x90 - (long)source) + (long)&this->super_IResult;
    uVar1 = (ulong)(Other->super_IResult).m_NumArgs;
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        this->m_apArgs[uVar2] =
             this->m_aStringStorage + ((long)Other->m_apArgs[uVar2] - (long)source);
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
  }
  return this;
}

Assistant:

CResult &operator =(const CResult &Other)
		{
			if(this != &Other)
			{
				IResult::operator=(Other);
				mem_copy(m_aStringStorage, Other.m_aStringStorage, sizeof(m_aStringStorage));
				m_pArgsStart = m_aStringStorage+(Other.m_pArgsStart-Other.m_aStringStorage);
				m_pCommand = m_aStringStorage+(Other.m_pCommand-Other.m_aStringStorage);
				for(unsigned i = 0; i < Other.m_NumArgs; ++i)
					m_apArgs[i] = m_aStringStorage+(Other.m_apArgs[i]-Other.m_aStringStorage);
			}
			return *this;
		}